

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O1

void __thiscall wasm::WasmBinaryWriter::writeFeaturesSection(WasmBinaryWriter *this)

{
  Module *pMVar1;
  char *__s;
  undefined *puVar2;
  pointer ppcVar3;
  undefined **ppuVar4;
  size_t sVar5;
  size_t in_RCX;
  void *__buf;
  uint uVar6;
  char **f;
  pointer ppcVar7;
  bool bVar8;
  string_view name;
  string_view name_00;
  pointer ppcStack_58;
  vector<const_char_*,_std::allocator<const_char_*>_> features;
  char *local_38;
  
  pMVar1 = this->wasm;
  if ((pMVar1->hasFeaturesSection == true) && ((pMVar1->features).features != 0)) {
    ppcStack_58 = (pointer)0x0;
    features.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    features.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    uVar6 = 1;
    do {
      if (((pMVar1->features).features & uVar6) != 0) {
        if ((int)uVar6 < 0x800) {
          if ((int)uVar6 < 0x40) {
            if (uVar6 - 1 < 8) {
              in_RCX = (long)&switchD_00c754b2::switchdataD_00e4d2c0 +
                       (long)(int)(&switchD_00c754b2::switchdataD_00e4d2c0)[uVar6 - 1];
              ppuVar4 = &BinaryConsts::CustomSections::AtomicsFeature;
              switch(uVar6) {
              case 1:
                break;
              case 2:
                ppuVar4 = &BinaryConsts::CustomSections::MutableGlobalsFeature;
                break;
              default:
switchD_00c754b2_caseD_3:
                handle_unreachable("unexpected feature flag",
                                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-binary.cpp"
                                   ,0x56f);
              case 4:
                ppuVar4 = &BinaryConsts::CustomSections::TruncSatFeature;
                break;
              case 8:
                ppuVar4 = &BinaryConsts::CustomSections::SIMD128Feature;
              }
            }
            else if (uVar6 == 0x10) {
              ppuVar4 = &BinaryConsts::CustomSections::BulkMemoryFeature;
            }
            else {
              if (uVar6 != 0x20) goto switchD_00c754b2_caseD_3;
              ppuVar4 = &BinaryConsts::CustomSections::SignExtFeature;
            }
          }
          else if ((int)uVar6 < 0x100) {
            if (uVar6 == 0x40) {
              ppuVar4 = &BinaryConsts::CustomSections::ExceptionHandlingFeature;
            }
            else {
              if (uVar6 != 0x80) goto switchD_00c754b2_caseD_3;
              ppuVar4 = &BinaryConsts::CustomSections::TailCallFeature;
            }
          }
          else if (uVar6 == 0x100) {
            ppuVar4 = (undefined **)&BinaryConsts::CustomSections::ReferenceTypesFeature;
          }
          else if (uVar6 == 0x200) {
            ppuVar4 = &BinaryConsts::CustomSections::MultivalueFeature;
          }
          else {
            if (uVar6 != 0x400) goto switchD_00c754b2_caseD_3;
            ppuVar4 = &BinaryConsts::CustomSections::GCFeature;
          }
        }
        else if ((int)uVar6 < 0x10000) {
          if ((int)uVar6 < 0x2000) {
            if (uVar6 == 0x800) {
              ppuVar4 = &BinaryConsts::CustomSections::Memory64Feature;
            }
            else {
              if (uVar6 != 0x1000) goto switchD_00c754b2_caseD_3;
              ppuVar4 = &BinaryConsts::CustomSections::RelaxedSIMDFeature;
            }
          }
          else if (uVar6 == 0x2000) {
            ppuVar4 = &BinaryConsts::CustomSections::ExtendedConstFeature;
          }
          else if (uVar6 == 0x4000) {
            ppuVar4 = (undefined **)&BinaryConsts::CustomSections::StringsFeature;
          }
          else {
            if (uVar6 != 0x8000) goto switchD_00c754b2_caseD_3;
            ppuVar4 = &BinaryConsts::CustomSections::MultiMemoryFeature;
          }
        }
        else if ((int)uVar6 < 0x80000) {
          if (uVar6 == 0x10000) {
            ppuVar4 = &BinaryConsts::CustomSections::StackSwitchingFeature;
          }
          else if (uVar6 == 0x20000) {
            ppuVar4 = &BinaryConsts::CustomSections::SharedEverythingFeature;
          }
          else {
            if (uVar6 != 0x40000) goto switchD_00c754b2_caseD_3;
            ppuVar4 = &BinaryConsts::CustomSections::FP16Feature;
          }
        }
        else if (uVar6 == 0x80000) {
          ppuVar4 = &BinaryConsts::CustomSections::BulkMemoryOptFeature;
        }
        else if (uVar6 == 0x100000) {
          ppuVar4 = &BinaryConsts::CustomSections::CallIndirectOverlongFeature;
        }
        else {
          if (uVar6 != 0x200000) goto switchD_00c754b2_caseD_3;
          ppuVar4 = &BinaryConsts::CustomSections::CustomDescriptorsFeature;
        }
        local_38 = *ppuVar4;
        std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
                  ((vector<char_const*,std::allocator<char_const*>> *)&ppcStack_58,&local_38);
      }
      bVar8 = uVar6 < 0x200000;
      uVar6 = uVar6 * 2;
    } while (bVar8);
    features.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ =
         startSection<wasm::BinaryConsts::Section>(this,Custom);
    puVar2 = BinaryConsts::CustomSections::TargetFeatures;
    sVar5 = strlen(BinaryConsts::CustomSections::TargetFeatures);
    name._M_str = puVar2;
    name._M_len = sVar5;
    writeInlineString(this,name);
    local_38 = (char *)CONCAT44(local_38._4_4_,
                                (int)((ulong)((long)features.
                                                  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start -
                                             (long)ppcStack_58) >> 3));
    LEB<unsigned_int,_unsigned_char>::write
              ((LEB<unsigned_int,_unsigned_char> *)&local_38,(int)this->o,__buf,in_RCX);
    ppcVar3 = features.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (ppcStack_58 !=
        features.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      ppcVar7 = ppcStack_58;
      do {
        local_38 = (char *)CONCAT71(local_38._1_7_,0x2b);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                  (&this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,
                   (uchar *)&local_38);
        __s = *ppcVar7;
        sVar5 = strlen(__s);
        name_00._M_str = __s;
        name_00._M_len = sVar5;
        writeInlineString(this,name_00);
        ppcVar7 = ppcVar7 + 1;
      } while (ppcVar7 != ppcVar3);
    }
    finishSection(this,features.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    if (ppcStack_58 != (pointer)0x0) {
      operator_delete(ppcStack_58,
                      (long)features.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppcStack_58);
    }
  }
  return;
}

Assistant:

void WasmBinaryWriter::writeFeaturesSection() {
  if (!wasm->hasFeaturesSection || wasm->features.isMVP()) {
    return;
  }

  // TODO(tlively): unify feature names with rest of toolchain and use
  // FeatureSet::toString()
  auto toString = [](FeatureSet::Feature f) {
    switch (f) {
      case FeatureSet::Atomics:
        return BinaryConsts::CustomSections::AtomicsFeature;
      case FeatureSet::MutableGlobals:
        return BinaryConsts::CustomSections::MutableGlobalsFeature;
      case FeatureSet::TruncSat:
        return BinaryConsts::CustomSections::TruncSatFeature;
      case FeatureSet::SIMD:
        return BinaryConsts::CustomSections::SIMD128Feature;
      case FeatureSet::BulkMemory:
        return BinaryConsts::CustomSections::BulkMemoryFeature;
      case FeatureSet::SignExt:
        return BinaryConsts::CustomSections::SignExtFeature;
      case FeatureSet::ExceptionHandling:
        return BinaryConsts::CustomSections::ExceptionHandlingFeature;
      case FeatureSet::TailCall:
        return BinaryConsts::CustomSections::TailCallFeature;
      case FeatureSet::ReferenceTypes:
        return BinaryConsts::CustomSections::ReferenceTypesFeature;
      case FeatureSet::Multivalue:
        return BinaryConsts::CustomSections::MultivalueFeature;
      case FeatureSet::GC:
        return BinaryConsts::CustomSections::GCFeature;
      case FeatureSet::Memory64:
        return BinaryConsts::CustomSections::Memory64Feature;
      case FeatureSet::RelaxedSIMD:
        return BinaryConsts::CustomSections::RelaxedSIMDFeature;
      case FeatureSet::ExtendedConst:
        return BinaryConsts::CustomSections::ExtendedConstFeature;
      case FeatureSet::Strings:
        return BinaryConsts::CustomSections::StringsFeature;
      case FeatureSet::MultiMemory:
        return BinaryConsts::CustomSections::MultiMemoryFeature;
      case FeatureSet::StackSwitching:
        return BinaryConsts::CustomSections::StackSwitchingFeature;
      case FeatureSet::SharedEverything:
        return BinaryConsts::CustomSections::SharedEverythingFeature;
      case FeatureSet::FP16:
        return BinaryConsts::CustomSections::FP16Feature;
      case FeatureSet::BulkMemoryOpt:
        return BinaryConsts::CustomSections::BulkMemoryOptFeature;
      case FeatureSet::CallIndirectOverlong:
        return BinaryConsts::CustomSections::CallIndirectOverlongFeature;
      case FeatureSet::CustomDescriptors:
        return BinaryConsts::CustomSections::CustomDescriptorsFeature;
      case FeatureSet::None:
      case FeatureSet::Default:
      case FeatureSet::All:
        break;
    }
    WASM_UNREACHABLE("unexpected feature flag");
  };

  std::vector<const char*> features;
  wasm->features.iterFeatures(
    [&](FeatureSet::Feature f) { features.push_back(toString(f)); });

  auto start = startSection(BinaryConsts::Custom);
  writeInlineString(BinaryConsts::CustomSections::TargetFeatures);
  o << U32LEB(features.size());
  for (auto& f : features) {
    o << uint8_t(BinaryConsts::FeatureUsed);
    writeInlineString(f);
  }
  finishSection(start);
}